

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O0

RABlock * __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
          (ZoneStack<asmjit::v1_14::RABlock_*> *this)

{
  long lVar1;
  RABlock *pRVar2;
  bool bVar3;
  undefined8 *middleIndex;
  ZoneStackBase *in_RDI;
  RABlock *item;
  RABlock **ptr;
  Block *block;
  char *in_stack_000003a0;
  int in_stack_000003ac;
  char *in_stack_000003b0;
  ZoneStackBase *this_00;
  
  if (*(long *)in_RDI == 0) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  this_00 = in_RDI;
  bVar3 = ZoneStackBase::empty(in_RDI);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  lVar1 = *(long *)(in_RDI + 8);
  if (*(long *)(lVar1 + 0x10) == *(long *)(lVar1 + 0x18)) {
    DebugUtils::assertionFailed(in_stack_000003b0,in_stack_000003ac,in_stack_000003a0);
  }
  middleIndex = *(undefined8 **)(lVar1 + 0x10) + 1;
  pRVar2 = (RABlock *)**(undefined8 **)(lVar1 + 0x10);
  *(undefined8 **)(lVar1 + 0x10) = middleIndex;
  if (*(long *)(lVar1 + 0x10) == *(long *)(lVar1 + 0x18)) {
    ZoneStackBase::_cleanupBlock(this_00,(uint32_t)((ulong)lVar1 >> 0x20),(size_t)middleIndex);
  }
  return pRVar2;
}

Assistant:

inline T popFirst() noexcept {
    ASMJIT_ASSERT(isInitialized());
    ASMJIT_ASSERT(!empty());

    Block* block = _block[kBlockIndexFirst];
    ASMJIT_ASSERT(!block->empty());

    T* ptr = block->start<T>();
    T item = *ptr++;

    block->setStart(ptr);
    if (block->empty())
      _cleanupBlock(kBlockIndexFirst, kMidBlockIndex);

    return item;
  }